

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O2

SUNMatrix SUNMatClone(SUNMatrix A)

{
  SUNMatrix p_Var1;
  
  p_Var1 = (*A->ops->clone)(A);
  p_Var1->sunctx = A->sunctx;
  return p_Var1;
}

Assistant:

SUNMatrix SUNMatClone(SUNMatrix A)
{
  SUNMatrix B = NULL;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(A));
  B = A->ops->clone(A);
  B->sunctx = A->sunctx;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(A));
  return(B);
}